

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

void dxil_spv::scrub_rov_lock_regions
               (CFGNode *node,bool preserve_first_begin,bool preserve_last_end)

{
  pointer ppOVar1;
  ulong uVar2;
  pointer ppOVar3;
  pointer ppOVar4;
  size_t __n;
  undefined7 in_register_00000031;
  pointer ppOVar5;
  ulong uVar6;
  pointer ppOVar7;
  long lVar8;
  bool bVar9;
  
  ppOVar7 = (node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppOVar4 = (node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppOVar3 = ppOVar7;
  if ((int)CONCAT71(in_register_00000031,preserve_first_begin) != 0) {
    uVar2 = (long)ppOVar4 - (long)ppOVar7;
    ppOVar5 = ppOVar7;
    if (0 < (long)uVar2 >> 5) {
      ppOVar5 = (pointer)((uVar2 & 0xffffffffffffffe0) + (long)ppOVar7);
      lVar8 = ((long)uVar2 >> 5) + 1;
      ppOVar3 = ppOVar7 + 2;
      do {
        if (ppOVar3[-2]->op == OpBeginInvocationInterlockEXT) {
          ppOVar3 = ppOVar3 + -2;
          goto LAB_00132869;
        }
        if (ppOVar3[-1]->op == OpBeginInvocationInterlockEXT) {
          ppOVar3 = ppOVar3 + -1;
          goto LAB_00132869;
        }
        if ((*ppOVar3)->op == OpBeginInvocationInterlockEXT) goto LAB_00132869;
        if (ppOVar3[1]->op == OpBeginInvocationInterlockEXT) {
          ppOVar3 = ppOVar3 + 1;
          goto LAB_00132869;
        }
        lVar8 = lVar8 + -1;
        ppOVar3 = ppOVar3 + 4;
      } while (1 < lVar8);
      uVar2 = (long)ppOVar4 - (long)ppOVar5;
    }
    lVar8 = (long)uVar2 >> 3;
    if (lVar8 == 1) {
LAB_00132847:
      ppOVar3 = ppOVar5;
      if ((*ppOVar5)->op != OpBeginInvocationInterlockEXT) {
        ppOVar3 = ppOVar4;
      }
    }
    else if (lVar8 == 2) {
LAB_00132838:
      ppOVar3 = ppOVar5;
      if ((*ppOVar5)->op != OpBeginInvocationInterlockEXT) {
        ppOVar5 = ppOVar5 + 1;
        goto LAB_00132847;
      }
    }
    else {
      if (lVar8 != 3) goto LAB_00132af2;
      ppOVar3 = ppOVar5;
      if ((*ppOVar5)->op != OpBeginInvocationInterlockEXT) {
        ppOVar5 = ppOVar5 + 1;
        goto LAB_00132838;
      }
    }
LAB_00132869:
    if (ppOVar3 == ppOVar4) {
LAB_00132af2:
      __assert_fail("begin_itr != node->ir.operations.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x1cd,"void dxil_spv::scrub_rov_begin_lock(CFGNode *, bool)");
    }
    ppOVar3 = ppOVar3 + 1;
  }
  uVar2 = (long)ppOVar4 - (long)ppOVar3;
  if (0 < (long)uVar2 >> 5) {
    ppOVar5 = (pointer)((uVar2 & 0xffffffffffffffe0) + (long)ppOVar3);
    lVar8 = ((long)uVar2 >> 5) + 1;
    ppOVar3 = ppOVar3 + 2;
    do {
      if (ppOVar3[-2]->op == OpBeginInvocationInterlockEXT) {
        ppOVar3 = ppOVar3 + -2;
        goto LAB_00132946;
      }
      if (ppOVar3[-1]->op == OpBeginInvocationInterlockEXT) {
        ppOVar3 = ppOVar3 + -1;
        goto LAB_00132946;
      }
      if ((*ppOVar3)->op == OpBeginInvocationInterlockEXT) goto LAB_00132946;
      if (ppOVar3[1]->op == OpBeginInvocationInterlockEXT) {
        ppOVar3 = ppOVar3 + 1;
        goto LAB_00132946;
      }
      lVar8 = lVar8 + -1;
      ppOVar3 = ppOVar3 + 4;
    } while (1 < lVar8);
    uVar2 = (long)ppOVar4 - (long)ppOVar5;
    ppOVar3 = ppOVar5;
  }
  lVar8 = (long)uVar2 >> 3;
  if (lVar8 == 1) {
LAB_00132924:
    if ((*ppOVar3)->op != OpBeginInvocationInterlockEXT) {
      ppOVar3 = ppOVar4;
    }
LAB_00132946:
    ppOVar5 = ppOVar3 + 1;
    if (ppOVar5 != ppOVar4 && ppOVar3 != ppOVar4) {
      do {
        if ((*ppOVar5)->op != OpBeginInvocationInterlockEXT) {
          *ppOVar3 = *ppOVar5;
          ppOVar3 = ppOVar3 + 1;
        }
        ppOVar5 = ppOVar5 + 1;
      } while (ppOVar5 != ppOVar4);
      ppOVar7 = (node->ir).operations.
                super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppOVar4 = (node->ir).operations.
                super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (ppOVar3 != ppOVar4) {
      (node->ir).operations.
      super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppOVar3;
      ppOVar4 = ppOVar3;
    }
  }
  else {
    if (lVar8 == 2) {
LAB_00132915:
      if ((*ppOVar3)->op != OpBeginInvocationInterlockEXT) {
        ppOVar3 = ppOVar3 + 1;
        goto LAB_00132924;
      }
      goto LAB_00132946;
    }
    if (lVar8 == 3) {
      if ((*ppOVar3)->op != OpBeginInvocationInterlockEXT) {
        ppOVar3 = ppOVar3 + 1;
        goto LAB_00132915;
      }
      goto LAB_00132946;
    }
  }
  ppOVar3 = ppOVar4;
  if (preserve_last_end) {
    lVar8 = (long)ppOVar4 - (long)ppOVar7 >> 3;
    ppOVar5 = ppOVar4;
    do {
      bVar9 = lVar8 == 0;
      lVar8 = lVar8 + -1;
      ppOVar3 = ppOVar4;
      if (bVar9) break;
      ppOVar1 = ppOVar5 + -1;
      ppOVar5 = ppOVar5 + -1;
      ppOVar3 = ppOVar5;
    } while ((*ppOVar1)->op != OpEndInvocationInterlockEXT);
  }
  uVar6 = (long)ppOVar3 - (long)ppOVar7;
  ppOVar4 = ppOVar7;
  uVar2 = uVar6;
  if (0 < (long)uVar6 >> 5) {
    ppOVar4 = (pointer)((uVar6 & 0xffffffffffffffe0) + (long)ppOVar7);
    lVar8 = ((long)uVar6 >> 5) + 1;
    ppOVar5 = ppOVar7 + 2;
    do {
      if (ppOVar5[-2]->op == OpEndInvocationInterlockEXT) {
        ppOVar5 = ppOVar5 + -2;
        goto LAB_00132a7f;
      }
      if (ppOVar5[-1]->op == OpEndInvocationInterlockEXT) {
        ppOVar5 = ppOVar5 + -1;
        goto LAB_00132a7f;
      }
      if ((*ppOVar5)->op == OpEndInvocationInterlockEXT) goto LAB_00132a7f;
      if (ppOVar5[1]->op == OpEndInvocationInterlockEXT) {
        ppOVar5 = ppOVar5 + 1;
        goto LAB_00132a7f;
      }
      lVar8 = lVar8 + -1;
      ppOVar5 = ppOVar5 + 4;
    } while (1 < lVar8);
    uVar2 = (long)ppOVar3 - (long)ppOVar4;
  }
  lVar8 = (long)uVar2 >> 3;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      if (lVar8 != 3) {
        return;
      }
      ppOVar5 = ppOVar4;
      if ((*ppOVar4)->op == OpEndInvocationInterlockEXT) goto LAB_00132a7f;
      ppOVar4 = ppOVar4 + 1;
    }
    ppOVar5 = ppOVar4;
    if ((*ppOVar4)->op == OpEndInvocationInterlockEXT) goto LAB_00132a7f;
    ppOVar4 = ppOVar4 + 1;
  }
  ppOVar5 = ppOVar4;
  if ((*ppOVar4)->op != OpEndInvocationInterlockEXT) {
    ppOVar5 = ppOVar3;
  }
LAB_00132a7f:
  if ((ppOVar5 != ppOVar3) && (ppOVar4 = ppOVar5 + 1, ppOVar4 != ppOVar3)) {
    do {
      if ((*ppOVar4)->op != OpEndInvocationInterlockEXT) {
        *ppOVar5 = *ppOVar4;
        ppOVar5 = ppOVar5 + 1;
      }
      ppOVar4 = ppOVar4 + 1;
    } while (ppOVar4 != ppOVar3);
    ppOVar7 = (node->ir).operations.
              super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)ppOVar3 - (long)ppOVar7;
  }
  if (ppOVar5 != ppOVar3) {
    ppOVar7 = (pointer)(uVar6 + (long)ppOVar7);
    __n = (long)(node->ir).operations.
                super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar3;
    ppOVar4 = ppOVar3;
    if (__n != 0) {
      memmove(ppOVar5,ppOVar7,__n);
      ppOVar7 = (node->ir).operations.
                super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppOVar4 = ppOVar7;
    }
    ppOVar5 = (pointer)((long)ppOVar5 + ((long)ppOVar4 - (long)ppOVar3));
    if (ppOVar7 != ppOVar5) {
      (node->ir).operations.
      super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppOVar5;
    }
  }
  return;
}

Assistant:

static void scrub_rov_lock_regions(CFGNode *node, bool preserve_first_begin, bool preserve_last_end)
{
	scrub_rov_begin_lock(node, preserve_first_begin);
	scrub_rov_end_lock(node, preserve_last_end);
}